

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

string * units::generateUnitSequence(string *__return_storage_ptr__,double mux,string *seq)

{
  char cVar1;
  __const_iterator __p;
  int iVar2;
  size_type sVar3;
  size_type sVar4;
  char *pcVar5;
  bool numOnly;
  bool numOnly_00;
  bool numOnly_01;
  bool numOnly_02;
  bool numOnly_03;
  bool numOnly_04;
  bool numOnly_05;
  bool numOnly_06;
  undefined1 extraout_DL;
  bool numOnly_07;
  bool numOnly_08;
  bool numOnly_09;
  bool numOnly_10;
  undefined1 extraout_DL_00;
  undefined1 uVar6;
  bool numOnly_11;
  undefined1 extraout_DL_01;
  bool numOnly_12;
  byte bVar7;
  double dVar8;
  size_type sStack_80;
  string muxstr;
  string local_48;
  
  iVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)seq,0,3,"m^3"
                 );
  if (iVar2 == 0) {
    if (0.1 < mux) {
LAB_00354169:
      bVar7 = 0;
    }
    else {
      pcVar5 = "L";
      sStack_80 = 3;
LAB_00354130:
      bVar7 = 0;
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)seq,0,
                 sStack_80,pcVar5);
      mux = mux * 1000.0;
    }
  }
  else {
    iVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)seq,0,4,
                    "m^-3");
    if (iVar2 == 0) {
      if (mux <= 100.0) goto LAB_00354169;
      pcVar5 = "L^-1";
      sStack_80 = 4;
LAB_0035418d:
      bVar7 = 0;
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)seq,0,
                 sStack_80,pcVar5);
      mux = mux / 1000.0;
    }
    else {
      iVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)seq,0,5,
                      "kg^-1");
      if (iVar2 == 0) {
        bVar7 = 1;
        if (100.0 < mux) {
          pcVar5 = "g^-1";
          sStack_80 = 5;
          goto LAB_0035418d;
        }
      }
      else {
        bVar7 = 0;
        iVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)seq,0
                          ,2,"kg");
        if (((iVar2 == 0) && (bVar7 = 1, mux <= 0.1)) &&
           ((seq->_M_string_length < 4 || ((seq->_M_dataplus)._M_p[2] != '^')))) {
          pcVar5 = "g";
          sStack_80 = 2;
          goto LAB_00354130;
        }
      }
    }
  }
  __p._M_current = (seq->_M_dataplus)._M_p;
  cVar1 = *__p._M_current;
  if ((mux == 1.0) && (!NAN(mux))) {
    if (cVar1 == '/') {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)seq,__p,'1');
    }
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)seq);
    return __return_storage_ptr__;
  }
  sVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)seq,'^',0)
  ;
  if (cVar1 == '/') {
    if (sVar3 == 0xffffffffffffffff) {
LAB_003542f5:
      muxstr._M_dataplus._M_p = (pointer)&muxstr.field_2;
      muxstr.field_2._M_local_buf[0] = '\0';
      muxstr._M_string_length = 0;
      getMultiplierString_abi_cxx11_(&local_48,(units *)(ulong)bVar7,1.0 / mux,numOnly);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&muxstr,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      bVar7 = *muxstr._M_dataplus._M_p;
      if (((byte)(bVar7 - 0x30) < 10) ||
         ((bVar7 < 0x2f && ((0x680000000000U >> ((ulong)(uint)bVar7 & 0x3f) & 1) != 0)))) {
        getMultiplierString_abi_cxx11_(&local_48,(units *)0x1,mux,numOnly_01);
        goto LAB_0035459d;
      }
LAB_003545cc:
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)seq,1,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&muxstr);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&muxstr,"1");
    }
    else {
      cVar1 = (seq->_M_dataplus)._M_p[sVar3 + 1];
      muxstr._M_dataplus._M_p = (pointer)&muxstr.field_2;
      muxstr._M_string_length = 0;
      muxstr.field_2._M_local_buf[0] = '\0';
      if (cVar1 == '3') {
        dVar8 = cbrt(1.0 / mux);
        getMultiplierString_abi_cxx11_(&local_48,(units *)(ulong)bVar7,dVar8,numOnly_05);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&muxstr,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_48);
        std::__cxx11::string::~string((string *)&local_48);
        bVar7 = *muxstr._M_dataplus._M_p;
        if ((9 < (byte)(bVar7 - 0x30)) &&
           ((0x2e < bVar7 || ((0x680000000000U >> ((ulong)(uint)bVar7 & 0x3f) & 1) == 0))))
        goto LAB_003545cc;
        getMultiplierString_abi_cxx11_(&local_48,(units *)0x1,mux,numOnly_06);
      }
      else if (cVar1 == '2') {
        dVar8 = 1.0 / mux;
        if (dVar8 < 0.0) {
          dVar8 = sqrt(dVar8);
          uVar6 = extraout_DL;
        }
        else {
          dVar8 = SQRT(dVar8);
          uVar6 = numOnly;
        }
        getMultiplierString_abi_cxx11_(&local_48,(units *)(ulong)bVar7,dVar8,(bool)uVar6);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&muxstr,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_48);
        std::__cxx11::string::~string((string *)&local_48);
        bVar7 = *muxstr._M_dataplus._M_p;
        if ((9 < (byte)(bVar7 - 0x30)) &&
           ((0x2e < bVar7 || ((0x680000000000U >> ((ulong)(uint)bVar7 & 0x3f) & 1) == 0))))
        goto LAB_003545cc;
        getMultiplierString_abi_cxx11_(&local_48,(units *)0x1,mux,numOnly_07);
      }
      else {
        if (cVar1 == '1') goto LAB_003542f5;
        getMultiplierString_abi_cxx11_(&local_48,(units *)0x1,mux,numOnly);
      }
LAB_0035459d:
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&muxstr,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_48);
      std::__cxx11::string::~string((string *)&local_48);
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&muxstr,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)seq);
    goto LAB_00354846;
  }
  if (sVar3 == 0xffffffffffffffff) {
    getMultiplierString_abi_cxx11_(&muxstr,(units *)(ulong)bVar7,mux,numOnly);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&muxstr,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)seq);
    goto LAB_00354846;
  }
  sVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          find_first_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)seq,
                        "*/)",0);
  if (sVar4 < sVar3) {
    getMultiplierString_abi_cxx11_(&muxstr,(units *)(ulong)bVar7,mux,numOnly_00);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&muxstr,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)seq);
    goto LAB_00354846;
  }
  sVar3 = ((seq->_M_dataplus)._M_p[sVar3 + 1] == '(') + sVar3 + 1;
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&muxstr,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)seq,sVar3,
             (sVar4 - sVar3) + 1);
  iVar2 = std::__cxx11::stoi(&muxstr,(size_t *)0x0,10);
  std::__cxx11::string::~string((string *)&muxstr);
  muxstr._M_dataplus._M_p = (pointer)&muxstr.field_2;
  muxstr._M_string_length = 0;
  muxstr.field_2._M_local_buf[0] = '\0';
  switch(iVar2) {
  default:
    getMultiplierString_abi_cxx11_(&local_48,(units *)0x1,mux,numOnly_02);
    break;
  case 2:
    if (mux < 0.0) {
      dVar8 = sqrt(mux);
      uVar6 = extraout_DL_01;
    }
    else {
      dVar8 = SQRT(mux);
      uVar6 = numOnly_02;
    }
    getMultiplierString_abi_cxx11_(&local_48,(units *)(ulong)bVar7,dVar8,(bool)uVar6);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&muxstr,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    bVar7 = *muxstr._M_dataplus._M_p;
    if ((9 < (byte)(bVar7 - 0x30)) &&
       ((0x2e < bVar7 || ((0x680000000000U >> ((ulong)(uint)bVar7 & 0x3f) & 1) == 0))))
    goto LAB_00354836;
    getMultiplierString_abi_cxx11_(&local_48,(units *)0x1,mux,numOnly_12);
    break;
  case 3:
    dVar8 = cbrt(mux);
    getMultiplierString_abi_cxx11_(&local_48,(units *)(ulong)bVar7,dVar8,numOnly_09);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&muxstr,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    bVar7 = *muxstr._M_dataplus._M_p;
    if ((9 < (byte)(bVar7 - 0x30)) &&
       ((0x2e < bVar7 || ((0x680000000000U >> ((ulong)(uint)bVar7 & 0x3f) & 1) == 0))))
    goto LAB_00354836;
    getMultiplierString_abi_cxx11_(&local_48,(units *)0x1,mux,numOnly_10);
    break;
  case -3:
    dVar8 = cbrt(1.0 / mux);
    getMultiplierString_abi_cxx11_(&local_48,(units *)(ulong)bVar7,dVar8,numOnly_03);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&muxstr,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    bVar7 = *muxstr._M_dataplus._M_p;
    if (((byte)(bVar7 - 0x30) < 10) ||
       ((bVar7 < 0x2f && ((0x680000000000U >> ((ulong)(uint)bVar7 & 0x3f) & 1) != 0)))) {
      getMultiplierString_abi_cxx11_(&local_48,(units *)0x1,mux,numOnly_04);
      break;
    }
    goto LAB_00354836;
  case -2:
    dVar8 = 1.0 / mux;
    if (dVar8 < 0.0) {
      dVar8 = sqrt(dVar8);
      uVar6 = extraout_DL_00;
    }
    else {
      dVar8 = SQRT(dVar8);
      uVar6 = numOnly_02;
    }
    getMultiplierString_abi_cxx11_(&local_48,(units *)(ulong)bVar7,dVar8,(bool)uVar6);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&muxstr,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    bVar7 = *muxstr._M_dataplus._M_p;
    if ((9 < (byte)(bVar7 - 0x30)) &&
       ((0x2e < bVar7 || ((0x680000000000U >> ((ulong)(uint)bVar7 & 0x3f) & 1) == 0))))
    goto LAB_00354836;
    getMultiplierString_abi_cxx11_(&local_48,(units *)0x1,mux,numOnly_11);
    break;
  case -1:
    getMultiplierString_abi_cxx11_(&local_48,(units *)(ulong)bVar7,1.0 / mux,numOnly_02);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&muxstr,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    bVar7 = *muxstr._M_dataplus._M_p;
    if ((9 < (byte)(bVar7 - 0x30)) &&
       ((0x2e < bVar7 || ((0x680000000000U >> ((ulong)(uint)bVar7 & 0x3f) & 1) == 0))))
    goto LAB_00354836;
    getMultiplierString_abi_cxx11_(&local_48,(units *)0x1,mux,numOnly_08);
  }
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&muxstr,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
LAB_00354836:
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&muxstr,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)seq);
LAB_00354846:
  std::__cxx11::string::~string((string *)&muxstr);
  return __return_storage_ptr__;
}

Assistant:

static std::string generateUnitSequence(double mux, std::string seq)
{
    bool noPrefix = false;
    // deal with a few common things
    if (seq.compare(0, 3, "m^3") == 0) {
        if (mux <= 0.1) {
            seq.replace(0, 3, "L");
            mux *= 1000.0;
        }
    } else if (seq.compare(0, 4, "m^-3") == 0) {
        if (mux > 100.0) {
            seq.replace(0, 4, "L^-1");
            mux /= 1000.0;
        }
    } else if (seq.compare(0, 5, "kg^-1") == 0) {
        if (mux > 100.0) {
            seq.replace(0, 5, "g^-1");
            mux /= 1000.0;
        } else {
            noPrefix = true;
        }
    } else if (seq.compare(0, 2, "kg") == 0) {
        if (mux <= 0.1) {
            if (seq.size() > 3 && seq[2] == '^') {
                noPrefix = true;
            } else {
                seq.replace(0, 2, "g");
                mux *= 1000.0;
            }
        } else {
            noPrefix = true;
        }
    }
    if (mux == 1.0) {
        if (seq.front() == '/') {
            seq.insert(seq.begin(), '1');
        }
        return seq;
    }
    if (seq.front() == '/') {
        int pw = 1;
        auto pwerloc = seq.find_first_of('^');
        if (pwerloc != std::string::npos) {
#ifdef UNITS_CONSTEXPR_IF_SUPPORTED
            if constexpr (
                detail::bitwidth::base_size == sizeof(std::uint32_t)) {
                pw = seq[pwerloc + 1] - '0';
            } else {
                if (seq.size() <= pwerloc + 2 ||
                    !isDigitCharacter(seq[pwerloc + 2])) {
                    pw = seq[pwerloc + 1] - '0';
                } else {
                    pw = 10;
                }
            }
#else
            if (detail::bitwidth::base_size == sizeof(std::uint32_t) ||
                seq.size() <= pwerloc + 2 ||
                !isDigitCharacter(seq[pwerloc + 2])) {
                pw = seq[pwerloc + 1] - '0';
            } else {
                pw = 10;
            }
#endif
        }
        std::string muxstr;
        switch (pw) {
            case 1:
                muxstr = getMultiplierString(1.0 / mux, noPrefix);
                if (isNumericalStartCharacter(muxstr.front())) {
                    muxstr = getMultiplierString(mux, true);
                } else {
                    seq.insert(1, muxstr);
                    muxstr = "1";
                }
                break;
            case 2:
                muxstr = getMultiplierString(std::sqrt(1.0 / mux), noPrefix);
                if (isNumericalStartCharacter(muxstr.front())) {
                    muxstr = getMultiplierString(mux, true);
                } else {
                    seq.insert(1, muxstr);
                    muxstr = "1";
                }
                break;
            case 3:
                muxstr = getMultiplierString(std::cbrt(1.0 / mux), noPrefix);
                if (isNumericalStartCharacter(muxstr.front())) {
                    muxstr = getMultiplierString(mux, true);
                } else {
                    seq.insert(1, muxstr);
                    muxstr = "1";
                }
                break;
            default:
                muxstr = getMultiplierString(mux, true);
        }
        return muxstr + seq;
    }
    auto pwerloc = seq.find_first_of('^');
    if (pwerloc == std::string::npos) {
        return getMultiplierString(mux, noPrefix) + seq;
    }
    auto mloc = seq.find_first_of("*/)");
    if (mloc < pwerloc) {
        return getMultiplierString(mux, noPrefix) + seq;
    }
    int offset = (seq[pwerloc + 1] != '(') ? 1 : 2;
    int pw = stoi(seq.substr(pwerloc + offset, mloc - pwerloc - offset + 1));
    std::string muxstr;
    switch (pw) {
        case -1:
            muxstr = getMultiplierString(1.0 / mux, noPrefix);
            if (isNumericalStartCharacter(muxstr.front())) {
                muxstr = getMultiplierString(mux, true);
            }
            break;
        case -2:
            muxstr = getMultiplierString(std::sqrt(1.0 / mux), noPrefix);
            if (isNumericalStartCharacter(muxstr.front())) {
                muxstr = getMultiplierString(mux, true);
            }
            break;
        case -3:
            muxstr = getMultiplierString(std::cbrt(1.0 / mux), noPrefix);
            if (isNumericalStartCharacter(muxstr.front())) {
                muxstr = getMultiplierString(mux, true);
            }
            break;
        case 2:
            muxstr = getMultiplierString(std::sqrt(mux), noPrefix);
            if (isNumericalStartCharacter(muxstr.front())) {
                muxstr = getMultiplierString(mux, true);
            }
            break;
        case 3:
            muxstr = getMultiplierString(std::cbrt(mux), noPrefix);
            if (isNumericalStartCharacter(muxstr.front())) {
                muxstr = getMultiplierString(mux, true);
            }
            break;
        default:
            muxstr = getMultiplierString(mux, true);
    }
    return muxstr + seq;
}